

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnodewalk.h
# Opt level: O3

ResultType __thiscall
ParseNodeWalker<WalkerPolicyTest>::WalkStringTemplate
          (ParseNodeWalker<WalkerPolicyTest> *this,ParseNodeStrTemplate *pnode,Context context)

{
  ResultType RVar1;
  bool bVar2;
  Context in_RCX;
  
  if ((pnode->field_0x2a & 1) == 0) {
    if (pnode->pnodeSubstitutionExpressions == (ParseNodePtr)0x0) {
      RVar1 = true;
    }
    else {
      RVar1 = WalkList(this,(ParseNode *)&pnode->pnodeSubstitutionExpressions,(ParseNode **)context,
                       in_RCX);
      bVar2 = ThreadContext::IsCurrentStackAvailable(0x2400);
      if (bVar2) goto LAB_0082b28b;
    }
    return RVar1;
  }
LAB_0082b28b:
  RVar1 = WalkList(this,(ParseNode *)&pnode->pnodeStringLiterals,(ParseNode **)context,in_RCX);
  return RVar1;
}

Assistant:

ResultType WalkStringTemplate(ParseNodeStrTemplate *pnode, Context context)
    {
        ResultType result;

        if (!pnode->isTaggedTemplate)
        {
            if (pnode->pnodeSubstitutionExpressions == nullptr)
            {
                // If we don't have any substitution expressions, then we should only have one string literal and not a list
                result = WalkNode(pnode->pnodeStringLiterals, context);
            }
            else
            {
                result = WalkList(pnode, pnode->pnodeSubstitutionExpressions, context);
                if (ContinueWalk(result))
                {
                    result = WalkList(pnode, pnode->pnodeStringLiterals, context);
                }
            }
        }
        else
        {
            result = WalkList(pnode, pnode->pnodeStringLiterals, context);
        }

        return result;
    }